

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scoped_trace_exception_tests.cpp
# Opt level: O0

void __thiscall
iu_ScopedTraceExceptionTest_x_iutest_x_Assertion_Test::
iu_ScopedTraceExceptionTest_x_iutest_x_Assertion_Test
          (iu_ScopedTraceExceptionTest_x_iutest_x_Assertion_Test *this)

{
  iu_ScopedTraceExceptionTest_x_iutest_x_Assertion_Test *this_local;
  
  iutest::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test =
       (_func_int **)&PTR__iu_ScopedTraceExceptionTest_x_iutest_x_Assertion_Test_00169098;
  return;
}

Assistant:

IUTEST(ScopedTraceExceptionTest, Assertion)
{
    IUTEST_SCOPED_TRACE("ScopedTraceExceptionTest Scoped Assertion A");
    {
        try
        {
            IUTEST_SCOPED_TRACE("ScopedTraceExceptionTest Scoped Assertion B");
            throw "error";
        }
        catch(...)
        {
        }
    }
    IUTEST_INFORM_EQ(1, 0);
}